

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::DiffuseAreaLight::L
          (DiffuseAreaLight *this,Point3f p,Normal3f n,Point2f uv,Vector3f w,
          SampledWavelengths *lambda)

{
  RGBColorSpace *cs;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  RGB *pRVar6;
  int c;
  int c_00;
  RGBIlluminantSpectrum *this_00;
  Float FVar7;
  undefined1 auVar8 [16];
  undefined1 auVar13 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined8 in_XMM2_Qb;
  undefined1 in_register_000012c4 [12];
  undefined8 in_XMM4_Qb;
  undefined8 in_XMM5_Qb;
  undefined1 auVar18 [16];
  RGB RVar19;
  SampledSpectrum SVar20;
  RGB local_b8;
  undefined1 local_a8 [16];
  DiffuseAreaLight *local_90;
  SampledWavelengths *local_88;
  WrapMode2D local_80;
  RGB local_78;
  RGBIlluminantSpectrum local_68;
  undefined1 local_50 [16];
  SampledSpectrum local_40;
  undefined1 auVar12 [12];
  undefined1 auVar17 [56];
  
  auVar17 = p._16_56_;
  auVar14._4_60_ = w._12_60_;
  auVar14._0_4_ = w.super_Tuple3<pbrt::Vector3,_float>.z;
  if (this->twoSided == false) {
    auVar8._8_8_ = in_XMM2_Qb;
    auVar8._0_8_ = n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar8 = vmovshdup_avx(auVar8);
    auVar4._8_8_ = in_XMM5_Qb;
    auVar4._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar1 = vmovshdup_avx(auVar4);
    auVar18 = ZEXT416((uint)(n.super_Tuple3<pbrt::Normal3,_float>.z * auVar14._0_4_));
    auVar8 = vfmadd213ss_fma(auVar1,auVar8,auVar18);
    auVar1._4_12_ = in_register_000012c4;
    auVar1._0_4_ = n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar1 = vfmsub213ss_fma(auVar14._0_16_,auVar1,auVar18);
    auVar17 = ZEXT856(0);
    auVar18._8_8_ = in_XMM2_Qb;
    auVar18._0_8_ = n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar5._8_8_ = in_XMM5_Qb;
    auVar5._0_8_ = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ + auVar1._0_4_)),auVar5,auVar18);
    if (auVar8._0_4_ < 0.0) {
      SampledSpectrum::SampledSpectrum(&local_40,0.0);
      return (array<float,_4>)local_40.values.values;
    }
  }
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    auVar13 = (undefined1  [56])0x0;
    local_a8._0_4_ = this->scale;
    SVar20 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
    auVar15._0_8_ = SVar20.values.values._8_8_;
    auVar15._8_56_ = auVar17;
    auVar9._0_8_ = SVar20.values.values._0_8_;
    auVar9._8_56_ = auVar13;
    auVar8 = vmovlhps_avx(auVar9._0_16_,auVar15._0_16_);
    this_00 = &local_68;
  }
  else {
    auVar14 = ZEXT464(0x3f800000);
    auVar2._8_8_ = in_XMM4_Qb;
    auVar2._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
    auVar8 = vmovshdup_avx(auVar2);
    c_00 = 0;
    local_b8.r = 0.0;
    local_b8.g = 0.0;
    local_b8.b = 0.0;
    auVar3._8_8_ = in_XMM4_Qb;
    auVar3._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
    local_a8 = vinsertps_avx(auVar3,ZEXT416((uint)(1.0 - auVar8._0_4_)),0x10);
    local_90 = this;
    local_88 = lambda;
    for (; auVar17 = auVar14._8_56_, c_00 != 3; c_00 = c_00 + 1) {
      WrapMode2D::WrapMode2D(&local_80,Clamp);
      FVar7 = Image::BilerpChannel(&this->image,(Point2f)local_a8._0_8_,c_00,local_80);
      pRVar6 = &local_b8;
      if ((c_00 != 0) && (pRVar6 = (RGB *)&local_b8.g, c_00 != 1)) {
        pRVar6 = (RGB *)&local_b8.b;
      }
      pRVar6->r = FVar7;
    }
    auVar13 = (undefined1  [56])0x0;
    cs = local_90->imageColorSpace;
    local_a8._0_4_ = local_90->scale;
    RVar19 = ClampZero(&local_b8);
    local_78.b = RVar19.b;
    auVar10._0_8_ = RVar19._0_8_;
    auVar10._8_56_ = auVar13;
    local_78._0_8_ = vmovlps_avx(auVar10._0_16_);
    RGBIlluminantSpectrum::RGBIlluminantSpectrum(&local_68,cs,&local_78);
    SVar20 = RGBIlluminantSpectrum::Sample(&local_68,local_88);
    auVar16._0_8_ = SVar20.values.values._8_8_;
    auVar16._8_56_ = auVar17;
    auVar11._0_8_ = SVar20.values.values._0_8_;
    auVar11._8_56_ = auVar13;
    auVar8 = vmovlhps_avx(auVar11._0_16_,auVar16._0_16_);
    this_00 = (RGBIlluminantSpectrum *)local_50;
  }
  auVar12 = auVar8._4_12_;
  this_00->scale = (Float)auVar8._0_4_;
  (this_00->rsp).c0 = (Float)auVar12._0_4_;
  (this_00->rsp).c1 = (Float)auVar12._4_4_;
  (this_00->rsp).c2 = (Float)auVar12._8_4_;
  SVar20 = SampledSpectrum::operator*((SampledSpectrum *)this_00,(Float)local_a8._0_4_);
  return (array<float,_4>)(array<float,_4>)SVar20;
}

Assistant:

L(Point3f p, Normal3f n, Point2f uv, Vector3f w,
                      const SampledWavelengths &lambda) const {
        if (!twoSided && Dot(n, w) < 0)
            return SampledSpectrum(0.f);
        if (image) {
            // Return _DiffuseAreaLight_ emission using image
            RGB rgb;
            Point2f st = uv;
            st[1] = 1 - st[1];
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.BilerpChannel(st, c);
            return scale *
                   RGBIlluminantSpectrum(*imageColorSpace, ClampZero(rgb)).Sample(lambda);

        } else
            return scale * Lemit.Sample(lambda);
    }